

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PackedArray.c
# Opt level: O0

void PackedArray_unpack(PackedArray *a,uint32_t offset,uint32_t *out,uint32_t count)

{
  uint32_t count_local;
  uint32_t *out_local;
  uint32_t offset_local;
  PackedArray *a_local;
  
  if (a == (PackedArray *)0x0) {
    __assert_fail("a != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ivan2kh[P]sort-big-file-with-a-limited-memory/PackedArray.c"
                  ,0x1cc,
                  "void PackedArray_unpack(const PackedArray *, const uint32_t, uint32_t *, uint32_t)"
                 );
  }
  if (out == (uint32_t *)0x0) {
    __assert_fail("out != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ivan2kh[P]sort-big-file-with-a-limited-memory/PackedArray.c"
                  ,0x1cd,
                  "void PackedArray_unpack(const PackedArray *, const uint32_t, uint32_t *, uint32_t)"
                 );
  }
  switch(a->bitsPerItem) {
  case 1:
    __PackedArray_unpack_1(&a[1].bitsPerItem,offset,out,count);
    break;
  case 2:
    __PackedArray_unpack_2(&a[1].bitsPerItem,offset,out,count);
    break;
  case 3:
    __PackedArray_unpack_3(&a[1].bitsPerItem,offset,out,count);
    break;
  case 4:
    __PackedArray_unpack_4(&a[1].bitsPerItem,offset,out,count);
    break;
  case 5:
    __PackedArray_unpack_5(&a[1].bitsPerItem,offset,out,count);
    break;
  case 6:
    __PackedArray_unpack_6(&a[1].bitsPerItem,offset,out,count);
    break;
  case 7:
    __PackedArray_unpack_7(&a[1].bitsPerItem,offset,out,count);
    break;
  case 8:
    __PackedArray_unpack_8(&a[1].bitsPerItem,offset,out,count);
    break;
  case 9:
    __PackedArray_unpack_9(&a[1].bitsPerItem,offset,out,count);
    break;
  case 10:
    __PackedArray_unpack_10(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0xb:
    __PackedArray_unpack_11(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0xc:
    __PackedArray_unpack_12(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0xd:
    __PackedArray_unpack_13(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0xe:
    __PackedArray_unpack_14(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0xf:
    __PackedArray_unpack_15(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0x10:
    __PackedArray_unpack_16(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0x11:
    __PackedArray_unpack_17(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0x12:
    __PackedArray_unpack_18(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0x13:
    __PackedArray_unpack_19(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0x14:
    __PackedArray_unpack_20(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0x15:
    __PackedArray_unpack_21(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0x16:
    __PackedArray_unpack_22(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0x17:
    __PackedArray_unpack_23(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0x18:
    __PackedArray_unpack_24(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0x19:
    __PackedArray_unpack_25(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0x1a:
    __PackedArray_unpack_26(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0x1b:
    __PackedArray_unpack_27(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0x1c:
    __PackedArray_unpack_28(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0x1d:
    __PackedArray_unpack_29(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0x1e:
    __PackedArray_unpack_30(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0x1f:
    __PackedArray_unpack_31(&a[1].bitsPerItem,offset,out,count);
    break;
  case 0x20:
    __PackedArray_unpack_32(&a[1].bitsPerItem,offset,out,count);
  }
  return;
}

Assistant:

void PackedArray_unpack(const PackedArray* a, const uint32_t offset, uint32_t* out, uint32_t count)
{
  PACKEDARRAY_ASSERT(a != NULL);
  PACKEDARRAY_ASSERT(out != NULL);

  switch (a->bitsPerItem)
  {
    case 1:   __PackedArray_unpack_1(a->buffer, offset, out, count); break;
    case 2:   __PackedArray_unpack_2(a->buffer, offset, out, count); break;
    case 3:   __PackedArray_unpack_3(a->buffer, offset, out, count); break;
    case 4:   __PackedArray_unpack_4(a->buffer, offset, out, count); break;
    case 5:   __PackedArray_unpack_5(a->buffer, offset, out, count); break;
    case 6:   __PackedArray_unpack_6(a->buffer, offset, out, count); break;
    case 7:   __PackedArray_unpack_7(a->buffer, offset, out, count); break;
    case 8:   __PackedArray_unpack_8(a->buffer, offset, out, count); break;
    case 9:   __PackedArray_unpack_9(a->buffer, offset, out, count); break;
    case 10:  __PackedArray_unpack_10(a->buffer, offset, out, count); break;
    case 11:  __PackedArray_unpack_11(a->buffer, offset, out, count); break;
    case 12:  __PackedArray_unpack_12(a->buffer, offset, out, count); break;
    case 13:  __PackedArray_unpack_13(a->buffer, offset, out, count); break;
    case 14:  __PackedArray_unpack_14(a->buffer, offset, out, count); break;
    case 15:  __PackedArray_unpack_15(a->buffer, offset, out, count); break;
    case 16:  __PackedArray_unpack_16(a->buffer, offset, out, count); break;
    case 17:  __PackedArray_unpack_17(a->buffer, offset, out, count); break;
    case 18:  __PackedArray_unpack_18(a->buffer, offset, out, count); break;
    case 19:  __PackedArray_unpack_19(a->buffer, offset, out, count); break;
    case 20:  __PackedArray_unpack_20(a->buffer, offset, out, count); break;
    case 21:  __PackedArray_unpack_21(a->buffer, offset, out, count); break;
    case 22:  __PackedArray_unpack_22(a->buffer, offset, out, count); break;
    case 23:  __PackedArray_unpack_23(a->buffer, offset, out, count); break;
    case 24:  __PackedArray_unpack_24(a->buffer, offset, out, count); break;
    case 25:  __PackedArray_unpack_25(a->buffer, offset, out, count); break;
    case 26:  __PackedArray_unpack_26(a->buffer, offset, out, count); break;
    case 27:  __PackedArray_unpack_27(a->buffer, offset, out, count); break;
    case 28:  __PackedArray_unpack_28(a->buffer, offset, out, count); break;
    case 29:  __PackedArray_unpack_29(a->buffer, offset, out, count); break;
    case 30:  __PackedArray_unpack_30(a->buffer, offset, out, count); break;
    case 31:  __PackedArray_unpack_31(a->buffer, offset, out, count); break;
    case 32:  __PackedArray_unpack_32(a->buffer, offset, out, count); break;
  }
}